

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::QuadO1::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,QuadO1 *this,MatrixXd *local)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar6;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  SVar7;
  non_const_type nVar8;
  Type local_b08;
  non_const_type local_ad0;
  non_const_type local_ac8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_ac0;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_ab0;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_a10;
  non_const_type local_a00;
  Type local_9f0;
  non_const_type local_9b8;
  XprTypeNested local_9b0;
  ColXpr local_9a8;
  ConstColXpr local_970;
  ConstColXpr local_938;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_900;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_888;
  double local_7e8;
  ConstColXpr local_7e0;
  ConstColXpr local_7a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_770;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_6f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_658;
  ColXpr local_508;
  ConstColXpr local_4d0;
  ConstColXpr local_498;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_460;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_3e8;
  double local_348;
  ConstColXpr local_340;
  ConstColXpr local_308;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_2d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_258;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_1b8;
  long local_68;
  Index i;
  uint local_4c;
  undefined1 local_48 [8];
  MatrixXd jacobian;
  uint local_28;
  byte local_21;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *local_20;
  MatrixXd *local_local;
  QuadO1 *this_local;
  MatrixXd *result;
  
  local_21 = 0;
  local_20 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)local;
  local_local = (MatrixXd *)this;
  this_local = (QuadO1 *)__return_storage_ptr__;
  local_28 = (*(this->super_Geometry)._vptr_Geometry[1])();
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  jacobian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IVar4 * 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_28,
             &jacobian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  local_4c = (*(this->super_Geometry)._vptr_Geometry[1])();
  i._0_4_ = 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_48,&local_4c,(int *)&i);
  local_68 = 0;
  while( true ) {
    lVar1 = local_68;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    if (IVar4 <= lVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_308,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_340,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
              (&local_2d0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
               &local_308,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)&local_340);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (local_20,1,local_68);
    local_348 = 1.0 - *pdVar5;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>>
    ::operator*(&local_258,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>>
                 *)&local_2d0,&local_348);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_498,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,2);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_4d0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
              (&local_460,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
               &local_498,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)&local_4d0);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (local_20,1,local_68);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>>
    ::operator*(&local_3e8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>>
                 *)&local_460,pdVar5);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(&local_1b8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_258,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_3e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_508,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_508,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)&local_1b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_7a8,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_7e0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
              (&local_770,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
               &local_7a8,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)&local_7e0);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (local_20,0,local_68);
    local_7e8 = 1.0 - *pdVar5;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>>
    ::operator*(&local_6f8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>>
                 *)&local_770,&local_7e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_938,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,2);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_970,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,1);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator-
              (&local_900,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
               &local_938,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)&local_970);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       (local_20,0,local_68);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>>
    ::operator*(&local_888,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>>
                 *)&local_900,pdVar5);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(&local_658,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_6f8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_888);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_9a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_9a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)&local_658);
    iVar2 = (*(this->super_Geometry)._vptr_Geometry[1])();
    if (iVar2 == 2) {
      local_9b8 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      local_9b0.m_matrix =
           (non_const_type)
           Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::inverse
                     ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                      &local_9b8);
      lVar1 = local_68 * 2;
      uVar3 = (*(this->super_Geometry)._vptr_Geometry[1])();
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                (&local_9f0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,lVar1,uVar3,2);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_9f0,
                 (DenseBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_9b0);
    }
    else {
      local_ac8 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      PVar6 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                         &local_ac8,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      local_ac0 = PVar6;
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
      ::colPivHouseholderQr
                (&local_ab0,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)&local_ac0);
      local_ad0 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      SVar7 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
              solve<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                        ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                          *)&local_ab0,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&local_ad0);
      local_a10 = SVar7;
      nVar8 = (non_const_type)
              Eigen::
              DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
              ::transpose((DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                           *)&local_a10);
      lVar1 = local_68 * 2;
      local_a00 = nVar8;
      uVar3 = (*(this->super_Geometry)._vptr_Geometry[1])();
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,int>
                (&local_b08,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,lVar1,uVar3,2);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_b08,
                 (DenseBase<Eigen::Transpose<const_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                  *)&local_a00);
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
                (&local_ab0);
    }
    local_68 = local_68 + 1;
  }
  local_21 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  if ((local_21 & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd QuadO1::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  Eigen::MatrixXd result(DimGlobal(), local.cols() * 2);
  Eigen::MatrixXd jacobian(DimGlobal(), 2);

  // Loop over all evaluatin points
  for (Eigen::Index i = 0; i < local.cols(); ++i) {
    // Compute Jacobian matrix in one evaluation point.
    jacobian.col(0) = (coords_.col(1) - coords_.col(0)) * (1 - local(1, i)) +
                      (coords_.col(2) - coords_.col(3)) * local(1, i);
    jacobian.col(1) = (coords_.col(3) - coords_.col(0)) * (1 - local(0, i)) +
                      (coords_.col(2) - coords_.col(1)) * local(0, i);
    // Distinguish whether the cell lies in a planar mesh or a surface mesh
    if (DimGlobal() == 2) {
      // Standard case: 2D planar mesh
      // Eigen has a built-in function for computing the inverse of a small
      // matrix
      result.block(0, 2 * i, DimGlobal(), 2) = jacobian.transpose().inverse();
    } else {
      result.block(0, 2 * i, DimGlobal(), 2) = (jacobian.transpose() * jacobian)
                                                   .colPivHouseholderQr()
                                                   .solve(jacobian.transpose())
                                                   .transpose();
    }
  }
  return result;
}